

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::ExceptionTranslatorRegistry::translateActiveException_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this)

{
  pointer puVar1;
  long *plVar2;
  char *pcVar3;
  string *psVar4;
  undefined8 uVar5;
  int iVar6;
  undefined1 auVar7 [12];
  exception_ptr local_40;
  exception_ptr local_38;
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  
  std::current_exception();
  local_40._M_exception_object = (void *)0x0;
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_40);
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_38);
  if (local_38._M_exception_object == (void *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Non C++ exception. Possibly a CLR exception.",
               (allocator<char> *)&local_38);
  }
  else {
    puVar1 = (this->m_translators).
             super__Vector_base<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>,_std::allocator<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar1 == (this->m_translators).
                  super__Vector_base<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>,_std::allocator<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::current_exception();
      auVar7 = std::rethrow_exception((exception_ptr)&local_38);
      iVar6 = auVar7._8_4_;
      uVar5 = auVar7._0_8_;
      if (iVar6 == 6) {
        __cxa_begin_catch(uVar5);
        std::current_exception();
        std::rethrow_exception((exception_ptr)local_30);
      }
      else if (iVar6 != 5) {
        if (iVar6 == 4) {
          plVar2 = (long *)__cxa_begin_catch(uVar5);
          pcVar3 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,pcVar3,(allocator<char> *)&local_40);
        }
        else if (iVar6 == 3) {
          psVar4 = (string *)__cxa_begin_catch(uVar5);
          std::__cxx11::string::string((string *)__return_storage_ptr__,psVar4);
        }
        else {
          pcVar3 = (char *)__cxa_begin_catch(uVar5);
          if (iVar6 == 2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,pcVar3,(allocator<char> *)&local_40);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"Unknown exception",
                       (allocator<char> *)&local_40);
          }
        }
        __cxa_end_catch();
        return __return_storage_ptr__;
      }
      __cxa_begin_catch();
      std::current_exception();
      uVar5 = std::rethrow_exception((exception_ptr)local_28);
      __cxa_end_catch();
      _Unwind_Resume(uVar5);
    }
    (*puVar1->m_ptr->_vptr_IExceptionTranslator[2])(__return_storage_ptr__,puVar1->m_ptr,puVar1 + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExceptionTranslatorRegistry::translateActiveException() const {
        // Compiling a mixed mode project with MSVC means that CLR
        // exceptions will be caught in (...) as well. However, these do
        // do not fill-in std::current_exception and thus lead to crash
        // when attempting rethrow.
        // /EHa switch also causes structured exceptions to be caught
        // here, but they fill-in current_exception properly, so
        // at worst the output should be a little weird, instead of
        // causing a crash.
        if ( std::current_exception() == nullptr ) {
            return "Non C++ exception. Possibly a CLR exception.";
        }

        // First we try user-registered translators. If none of them can
        // handle the exception, it will be rethrown handled by our defaults.
        try {
            return tryTranslators(m_translators);
        }
        // To avoid having to handle TFE explicitly everywhere, we just
        // rethrow it so that it goes back up the caller.
        catch( TestFailureException& ) {
            std::rethrow_exception(std::current_exception());
        }
        catch( TestSkipException& ) {
            std::rethrow_exception(std::current_exception());
        }
        catch( std::exception const& ex ) {
            return ex.what();
        }
        catch( std::string const& msg ) {
            return msg;
        }
        catch( const char* msg ) {
            return msg;
        }
        catch(...) {
            return "Unknown exception";
        }
    }